

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_dependency_manager.cpp
# Opt level: O2

vector<duckdb::LogicalIndex,_true> * __thiscall
duckdb::ColumnDependencyManager::CleanupInternals
          (vector<duckdb::LogicalIndex,_true> *__return_storage_ptr__,ColumnDependencyManager *this,
          idx_t column_amount)

{
  size_type __n;
  pointer pLVar1;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  long lVar5;
  idx_t i;
  _Hash_node_base *__n_00;
  pointer pLVar6;
  LogicalIndex current_index;
  vector<duckdb::LogicalIndex,_true> to_adjust;
  allocator_type local_61;
  value_type local_60;
  _Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_> local_58;
  _Hash_node_base *local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.index = 0xffffffffffffffff;
  ::std::vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>::vector
            (&__return_storage_ptr__->
              super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>,
             column_amount,&local_60,&local_61);
  local_38 = (this->deleted_columns)._M_h._M_before_begin._M_nxt[1]._M_nxt;
  lVar5 = 0;
  for (__n_00 = (_Hash_node_base *)0x0; pLVar1 = local_58._M_impl.super__Vector_impl_data._M_finish,
      pLVar6 = local_58._M_impl.super__Vector_impl_data._M_start,
      (_Hash_node_base *)column_amount != __n_00;
      __n_00 = (_Hash_node_base *)((long)&__n_00->_M_nxt + 1)) {
    local_60.index = (idx_t)__n_00;
    pvVar3 = vector<duckdb::LogicalIndex,_true>::get<true>(__return_storage_ptr__,(size_type)__n_00)
    ;
    pvVar3->index = (long)__n_00 - lVar5;
    sVar4 = ::std::
            _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(&(this->deleted_columns)._M_h,&local_60);
    if (sVar4 == 0) {
      if ((local_38 < __n_00) &&
         ((bVar2 = HasDependencies(this,(LogicalIndex)local_60.index), bVar2 ||
          (bVar2 = HasDependents(this,(LogicalIndex)local_60.index), bVar2)))) {
        ::std::vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>::push_back
                  ((vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_> *)&local_58,
                   &local_60);
      }
    }
    else {
      lVar5 = lVar5 + 1;
    }
  }
  for (; pLVar6 != pLVar1; pLVar6 = pLVar6 + 1) {
    __n = pLVar6->index;
    pvVar3 = vector<duckdb::LogicalIndex,_true>::get<true>(__return_storage_ptr__,__n);
    AdjustSingle(this,(LogicalIndex)pLVar6->index,__n - pvVar3->index);
  }
  ::std::
  _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(&(this->deleted_columns)._M_h);
  ::std::_Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>::~_Vector_base
            (&local_58);
  return __return_storage_ptr__;
}

Assistant:

vector<LogicalIndex> ColumnDependencyManager::CleanupInternals(idx_t column_amount) {
	vector<LogicalIndex> to_adjust;
	D_ASSERT(!deleted_columns.empty());
	// Get the lowest index that was deleted
	vector<LogicalIndex> new_indices(column_amount, LogicalIndex(DConstants::INVALID_INDEX));
	idx_t threshold = deleted_columns.begin()->index;

	idx_t offset = 0;
	for (idx_t i = 0; i < column_amount; i++) {
		auto current_index = LogicalIndex(i);
		auto new_index = LogicalIndex(i - offset);
		new_indices[i] = new_index;
		if (deleted_columns.count(current_index)) {
			offset++;
			continue;
		}
		if (i > threshold && (HasDependencies(current_index) || HasDependents(current_index))) {
			to_adjust.push_back(current_index);
		}
	}

	// Adjust all indices inside the dependency managers internal mappings
	for (auto &col : to_adjust) {
		auto offset = col.index - new_indices[col.index].index;
		AdjustSingle(col, offset);
	}
	deleted_columns.clear();
	return new_indices;
}